

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_any_args.hpp
# Opt level: O0

Elements * __thiscall
ftxui::unpack<std::shared_ptr<ftxui::Node>>
          (Elements *__return_storage_ptr__,ftxui *this,shared_ptr<ftxui::Node> *args)

{
  shared_ptr<ftxui::Node> local_30;
  undefined1 local_19;
  ftxui *local_18;
  shared_ptr<ftxui::Node> *args_local;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *vec;
  
  local_19 = 0;
  local_18 = this;
  args_local = (shared_ptr<ftxui::Node> *)__return_storage_ptr__;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (__return_storage_ptr__);
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_30,(shared_ptr<ftxui::Node> *)this);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,&local_30);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Elements unpack(Args... args) {
  std::vector<Element> vec;
  (Merge(vec, std::move(args)), ...);
  return vec;
}